

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O3

void __thiscall
DReachabilityPropagator::DReachabilityPropagator
          (DReachabilityPropagator *this,int _r,vec<BoolView> *_vs,vec<BoolView> *_es,
          vec<vec<int>_> *_in,vec<vec<int>_> *_out,vec<vec<int>_> *_en)

{
  _Rb_tree_header *p_Var1;
  pointer *ppvVar2;
  undefined8 *puVar3;
  vector<int,std::allocator<int>> *pvVar4;
  int _r_00;
  iterator iVar5;
  iterator iVar6;
  void *pvVar7;
  pointer pvVar8;
  BoolView *pBVar9;
  pointer pvVar10;
  Tint *pTVar11;
  Tint *__s;
  vec<int> *pvVar12;
  FilteredLT *this_00;
  int *piVar13;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  int *pt;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ou;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  in;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  en;
  allocator_type local_109;
  value_type local_108;
  value_type local_e8;
  vector<int,_std::allocator<int>_> local_c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_a0;
  value_type local_98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  GraphPropagator::GraphPropagator(&this->super_GraphPropagator,_vs,_es,_en);
  (this->super_GraphPropagator).super_Propagator._vptr_Propagator =
       (_func_int **)&PTR__DReachabilityPropagator_0020fa70;
  this->lt = (FilteredLT *)0x0;
  this->root = _r;
  local_a0 = &this->nodes2edge;
  p_Var1 = &(this->new_node)._M_t._M_impl.super__Rb_tree_header;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->in_nodes_tsize = 0;
  this->in_nodes_size = 0;
  (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->in_nodes_list).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->new_node)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->rem_node)._M_t._M_impl.super__Rb_tree_header;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rem_node)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->new_edge)._M_t._M_impl.super__Rb_tree_header;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->new_edge)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->rem_edge)._M_t._M_impl.super__Rb_tree_header;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_b0 = &this->in;
  local_a8 = &this->ou;
  (this->ou).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ou).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ou).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->in).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->in).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rem_edge)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->in).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_e8,(ulong)_in->sz,&local_108,(allocator_type *)&local_98);
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(this->super_GraphPropagator).adj.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_GraphPropagator).adj.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->super_GraphPropagator).adj.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->super_GraphPropagator).adj.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_GraphPropagator).adj.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->super_GraphPropagator).adj.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_c8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_e8);
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (_in->sz != 0) {
    uVar19 = 0;
    do {
      pvVar12 = _in->data;
      if (pvVar12[uVar19].sz != 0) {
        lVar17 = 0;
        uVar15 = 0;
        do {
          pvVar4 = (vector<int,std::allocator<int>> *)
                   ((this->super_GraphPropagator).adj.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar19);
          piVar13 = (int *)((long)pvVar12[uVar19].data + lVar17);
          iVar5._M_current = *(int **)(pvVar4 + 8);
          if (iVar5._M_current == *(int **)(pvVar4 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar4,iVar5,piVar13);
            pvVar12 = _in->data;
          }
          else {
            *iVar5._M_current = *piVar13;
            *(int **)(pvVar4 + 8) = iVar5._M_current + 1;
          }
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 4;
        } while (uVar15 < pvVar12[uVar19].sz);
      }
      pvVar12 = _out->data;
      if (pvVar12[uVar19].sz != 0) {
        lVar17 = 0;
        uVar15 = 0;
        do {
          pvVar4 = (vector<int,std::allocator<int>> *)
                   ((this->super_GraphPropagator).adj.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar19);
          piVar13 = (int *)((long)pvVar12[uVar19].data + lVar17);
          iVar5._M_current = *(int **)(pvVar4 + 8);
          if (iVar5._M_current == *(int **)(pvVar4 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar4,iVar5,piVar13);
            pvVar12 = _out->data;
          }
          else {
            *iVar5._M_current = *piVar13;
            *(int **)(pvVar4 + 8) = iVar5._M_current + 1;
          }
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 4;
        } while (uVar15 < pvVar12[uVar19].sz);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < _in->sz);
    if (_in->sz != 0) {
      uVar19 = 0;
      do {
        iVar6._M_current =
             (this->in).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->in).
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::_M_realloc_insert<>(local_b0,iVar6);
        }
        else {
          ((iVar6._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((iVar6._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((iVar6._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ppvVar2 = &(this->in).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppvVar2 = *ppvVar2 + 1;
        }
        pvVar12 = _in->data;
        if (pvVar12[uVar19].sz != 0) {
          lVar17 = 0;
          uVar15 = 0;
          do {
            pvVar4 = (vector<int,std::allocator<int>> *)
                     ((local_b0->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar19);
            piVar13 = (int *)((long)pvVar12[uVar19].data + lVar17);
            iVar5._M_current = *(int **)(pvVar4 + 8);
            if (iVar5._M_current == *(int **)(pvVar4 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar4,iVar5,piVar13);
              pvVar12 = _in->data;
            }
            else {
              *iVar5._M_current = *piVar13;
              *(int **)(pvVar4 + 8) = iVar5._M_current + 1;
            }
            uVar15 = uVar15 + 1;
            lVar17 = lVar17 + 4;
          } while (uVar15 < pvVar12[uVar19].sz);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < _in->sz);
    }
  }
  if (_out->sz != 0) {
    uVar19 = 0;
    do {
      iVar6._M_current =
           (this->ou).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->ou).
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::_M_realloc_insert<>(local_a8,iVar6);
      }
      else {
        ((iVar6._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((iVar6._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ((iVar6._M_current)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppvVar2 = &(this->ou).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppvVar2 = *ppvVar2 + 1;
      }
      pvVar12 = _out->data;
      if (pvVar12[uVar19].sz != 0) {
        lVar17 = 0;
        uVar15 = 0;
        do {
          pvVar4 = (vector<int,std::allocator<int>> *)
                   ((local_a8->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar19);
          piVar13 = (int *)((long)pvVar12[uVar19].data + lVar17);
          iVar5._M_current = *(int **)(pvVar4 + 8);
          if (iVar5._M_current == *(int **)(pvVar4 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar4,iVar5,piVar13);
            pvVar12 = _out->data;
          }
          else {
            *iVar5._M_current = *piVar13;
            *(int **)(pvVar4 + 8) = iVar5._M_current + 1;
          }
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 4;
        } while (uVar15 < pvVar12[uVar19].sz);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < _out->sz);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_e8,(long)(int)(this->super_GraphPropagator).vs.sz,(allocator_type *)&local_108)
  ;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(this->nodes2edge).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->nodes2edge).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)(this->nodes2edge).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  (this->nodes2edge).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_c8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_e8);
  uVar14 = (this->super_GraphPropagator).vs.sz;
  uVar19 = (ulong)uVar14;
  if (0 < (int)uVar14) {
    lVar20 = 0;
    lVar17 = 0;
    do {
      local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,0xffffffff);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_c8,(long)(int)uVar19,(value_type_conflict1 *)&local_e8,
                 (allocator_type *)&local_108);
      pvVar10 = (local_a0->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar7 = *(void **)((long)&(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar20);
      puVar3 = (undefined8 *)
               ((long)&(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar20);
      *puVar3 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3[1] = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar20) =
           local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((pvVar7 != (void *)0x0) &&
         (operator_delete(pvVar7),
         (pointer)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar17 = lVar17 + 1;
      uVar14 = (this->super_GraphPropagator).vs.sz;
      uVar19 = (ulong)(int)uVar14;
      lVar20 = lVar20 + 0x18;
    } while (lVar17 < (long)uVar19);
  }
  uVar18 = (this->super_GraphPropagator).es.sz;
  if (0 < (int)uVar18) {
    pvVar10 = (this->super_GraphPropagator).endnodes.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (this->nodes2edge).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      piVar13 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      *(int *)(*(long *)&pvVar8[*piVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data + (long)piVar13[1] * 4) = (int)lVar17;
      lVar17 = lVar17 + 1;
      uVar18 = (this->super_GraphPropagator).es.sz;
      pvVar10 = pvVar10 + 1;
    } while (lVar17 < (int)uVar18);
    uVar14 = (this->super_GraphPropagator).vs.sz;
  }
  sVar16 = (long)(int)uVar14 * 4;
  if ((int)uVar14 < 0) {
    sVar16 = 0xffffffffffffffff;
  }
  pTVar11 = (Tint *)operator_new__(sVar16);
  this->last_state_n = pTVar11;
  sVar16 = (long)(int)uVar18 * 4;
  uVar19 = 0xffffffffffffffff;
  if (-1 < (int)uVar18) {
    uVar19 = sVar16;
  }
  __s = (Tint *)operator_new__(uVar19);
  this->last_state_e = __s;
  memset(pTVar11,2,(long)(int)uVar14 * 4);
  memset(__s,2,sVar16);
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_c8,(long)(int)uVar18,&local_e8,(allocator_type *)&local_108);
  if (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar14 = _en->sz;
  if (uVar14 != 0) {
    pvVar12 = _en->data;
    uVar19 = 0;
    do {
      if (pvVar12[uVar19].sz != 0) {
        lVar17 = 0;
        uVar15 = 0;
        do {
          pvVar4 = (vector<int,std::allocator<int>> *)
                   ((long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar19 * 0x18);
          piVar13 = (int *)((long)pvVar12[uVar19].data + lVar17);
          iVar5._M_current = *(int **)(pvVar4 + 8);
          if (iVar5._M_current == *(int **)(pvVar4 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar4,iVar5,piVar13);
            pvVar12 = _en->data;
          }
          else {
            *iVar5._M_current = *piVar13;
            *(int **)(pvVar4 + 8) = iVar5._M_current + 1;
          }
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 4;
        } while (uVar15 < pvVar12[uVar19].sz);
        uVar14 = _en->sz;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar14);
  }
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_e8,(long)(int)(this->super_GraphPropagator).vs.sz,&local_108,
           (allocator_type *)&local_98);
  if (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar14 = _in->sz;
  if (uVar14 != 0) {
    pvVar12 = _in->data;
    uVar19 = 0;
    do {
      if (pvVar12[uVar19].sz != 0) {
        lVar17 = 0;
        uVar15 = 0;
        do {
          pvVar4 = (vector<int,std::allocator<int>> *)
                   (local_e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar19 * 6);
          piVar13 = (int *)((long)pvVar12[uVar19].data + lVar17);
          iVar5._M_current = *(int **)(pvVar4 + 8);
          if (iVar5._M_current == *(int **)(pvVar4 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar4,iVar5,piVar13);
            pvVar12 = _in->data;
          }
          else {
            *iVar5._M_current = *piVar13;
            *(int **)(pvVar4 + 8) = iVar5._M_current + 1;
          }
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 4;
        } while (uVar15 < pvVar12[uVar19].sz);
        uVar14 = _in->sz;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar14);
  }
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_108,(long)(int)(this->super_GraphPropagator).vs.sz,&local_98,&local_109);
  if ((Tint *)local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (Tint *)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar14 = _out->sz;
  if (uVar14 != 0) {
    pvVar12 = _out->data;
    uVar19 = 0;
    do {
      if (pvVar12[uVar19].sz != 0) {
        lVar17 = 0;
        uVar15 = 0;
        do {
          pvVar4 = (vector<int,std::allocator<int>> *)
                   (local_108.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar19 * 6);
          piVar13 = (int *)((long)pvVar12[uVar19].data + lVar17);
          iVar5._M_current = *(int **)(pvVar4 + 8);
          if (iVar5._M_current == *(int **)(pvVar4 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar4,iVar5,piVar13);
            pvVar12 = _out->data;
          }
          else {
            *iVar5._M_current = *piVar13;
            *(int **)(pvVar4 + 8) = iVar5._M_current + 1;
          }
          uVar15 = uVar15 + 1;
          lVar17 = lVar17 + 4;
        } while (uVar15 < pvVar12[uVar19].sz);
        uVar14 = _out->sz;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar14);
  }
  this_00 = (FilteredLT *)operator_new(0x100);
  _r_00 = this->root;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_c8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_60,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_e8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_78,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_108);
  FilteredLT::FilteredLT(this_00,&this->super_GraphPropagator,_r_00,&local_48,&local_60,&local_78);
  this->lt = this_00;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  if (0 < (int)(this->super_GraphPropagator).vs.sz) {
    lVar20 = 0;
    lVar17 = 0;
    do {
      BoolView::attach((BoolView *)
                       ((long)&(((this->super_GraphPropagator).vs.data)->super_Var).super_Branching.
                               _vptr_Branching + lVar20),(Propagator *)this,(int)lVar17,6);
      lVar17 = lVar17 + 1;
      lVar20 = lVar20 + 0x10;
    } while (lVar17 < (int)(this->super_GraphPropagator).vs.sz);
  }
  if (0 < (int)(this->super_GraphPropagator).es.sz) {
    lVar17 = 0;
    lVar20 = 0;
    do {
      BoolView::attach((BoolView *)
                       ((long)&(((this->super_GraphPropagator).es.data)->super_Var).super_Branching.
                               _vptr_Branching + lVar17),(Propagator *)this,
                       (this->super_GraphPropagator).vs.sz + (int)lVar20,6);
      lVar20 = lVar20 + 1;
      lVar17 = lVar17 + 0x10;
    } while (lVar20 < (int)(this->super_GraphPropagator).es.sz);
  }
  uVar14 = this->root;
  pBVar9 = (this->super_GraphPropagator).vs.data;
  if (sat.assigns.data[(uint)pBVar9[uVar14].v] == '\0') {
    SAT::cEnqueue(&sat,(Lit)((uint)pBVar9[uVar14].s + pBVar9[uVar14].v * 2),(Reason)0x0);
    uVar14 = this->root;
  }
  else if ((uint)pBVar9[uVar14].s * 2 + -1 == (int)sat.assigns.data[(uint)pBVar9[uVar14].v])
  goto LAB_001cd31e;
  pTVar11 = this->last_state_n + (int)uVar14;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(4,pTVar11->v);
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       &pTVar11->v;
  vec<TrailElem>::push(&engine.trail,(TrailElem *)&local_98);
  pTVar11->v = 0;
  add_innode(this,this->root);
  if (0 < (int)(this->super_GraphPropagator).vs.sz) {
    uVar14 = 0;
    do {
      (*(this->super_GraphPropagator).super_Propagator._vptr_Propagator[0xe])(this,(ulong)uVar14);
      uVar14 = uVar14 + 1;
    } while ((int)uVar14 < (int)(this->super_GraphPropagator).vs.sz);
  }
LAB_001cd31e:
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_108);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_e8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_c8);
  return;
}

Assistant:

DReachabilityPropagator::DReachabilityPropagator(int _r, vec<BoolView>& _vs, vec<BoolView>& _es,
																								 vec<vec<edge_id> >& _in, vec<vec<edge_id> >& _out,
																								 vec<vec<int> >& _en)
		: GraphPropagator(_vs, _es, _en), root(_r), in_nodes_tsize(0) {
	adj = std::vector<std::vector<int> >(_in.size(), std::vector<int>());
	for (unsigned int i = 0; i < _in.size(); i++) {
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			adj[i].push_back(_in[i][j]);
		}
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			adj[i].push_back(_out[i][j]);
		}
	}

	for (unsigned int i = 0; i < _in.size(); i++) {
		if (DEBUG) {
			std::cout << "Incident to " << i << ": ";
		}
		in.emplace_back();
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			in[i].push_back(_in[i][j]);
			if (DEBUG) {
				std::cout << _in[i][j] << ", ";
			}
		}
		if (DEBUG) {
			std::cout << '\n';
		}
	}

	for (unsigned int i = 0; i < _out.size(); i++) {
		ou.emplace_back();
		if (DEBUG) {
			std::cout << "Outgoing from " << i << ": ";
		}
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			ou[i].push_back(_out[i][j]);
			if (DEBUG) {
				std::cout << _out[i][j] << ", ";
			}
		}
		if (DEBUG) {
			std::cout << '\n';
		}
	}

	nodes2edge = std::vector<std::vector<int> >(nbNodes());
	for (int i = 0; i < nbNodes(); i++) {
		nodes2edge[i] = std::vector<int>(nbNodes(), -1);
	}
	for (int e = 0; e < nbEdges(); e++) {
		nodes2edge[getTail(e)][getHead(e)] = e;
	}

	last_state_n = new Tint[nbNodes()];
	last_state_e = new Tint[nbEdges()];
	memset((int*)last_state_n, UNK, sizeof(Tint) * nbNodes());
	memset((int*)last_state_e, UNK, sizeof(Tint) * nbEdges());

	std::vector<std::vector<int> > en(nbEdges(), std::vector<int>());
	for (unsigned int i = 0; i < _en.size(); i++) {
		for (unsigned int j = 0; j < _en[i].size(); j++) {
			en[i].push_back(_en[i][j]);
		}
	}

	std::vector<std::vector<int> > in(nbNodes(), std::vector<int>());
	for (unsigned int i = 0; i < _in.size(); i++) {
		for (unsigned int j = 0; j < _in[i].size(); j++) {
			in[i].push_back(_in[i][j]);
		}
	}

	std::vector<std::vector<int> > ou(nbNodes(), std::vector<int>());
	for (unsigned int i = 0; i < _out.size(); i++) {
		for (unsigned int j = 0; j < _out[i].size(); j++) {
			ou[i].push_back(_out[i][j]);
		}
	}

	lt = new FilteredLT(this, get_root_idx(), en, in, ou);

	for (int i = 0; i < nbNodes(); i++) {
		getNodeVar(i).attach(this, i, EVENT_LU);
	}

	for (int j = 0; j < nbEdges(); j++) {
		getEdgeVar(j).attach(this, nbNodes() + j, EVENT_LU);
	}

	if (!getNodeVar(root).isFixed()) {
		getNodeVar(root).setVal(true, nullptr);
	} else if (getNodeVar(root).isFalse()) {
		return;  // Will fail anyway because of unreachability.
	}
	last_state_n[root] = VT_IN;
	add_innode(root);

	for (int i = 0; i < nbNodes(); i++) {
		remove_deg1(i);
	}
}